

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

int xmlDebugCheckDocument(FILE *output,xmlDocPtr doc)

{
  xmlDebugCtxt ctxt;
  xmlDebugCtxt local_b8;
  
  if (output == (FILE *)0x0) {
    output = _stdout;
  }
  xmlCtxtDumpInitCtxt(&local_b8);
  local_b8.check = 1;
  local_b8.output = output;
  xmlCtxtDumpDocument(&local_b8,doc);
  return local_b8.errors;
}

Assistant:

int
xmlDebugCheckDocument(FILE * output, xmlDocPtr doc)
{
    xmlDebugCtxt ctxt;

    if (output == NULL)
	output = stdout;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    ctxt.check = 1;
    xmlCtxtDumpDocument(&ctxt, doc);
    xmlCtxtDumpCleanCtxt(&ctxt);
    return(ctxt.errors);
}